

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O3

BOOL __thiscall
Js::CustomExternalWrapperObject::SetItem
          (CustomExternalWrapperObject *this,uint32 index,Var value,PropertyOperationFlags flags)

{
  ImplicitCallFlags IVar1;
  ScriptContext *scriptContext;
  ThreadContext *this_00;
  Type *pTVar2;
  JavascriptBoolean *pJVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  BOOL BVar7;
  Attributes attributes;
  int iVar8;
  JavascriptFunction *function;
  undefined4 *puVar9;
  ulong uVar10;
  uint64 uVar11;
  uint64 uVar12;
  JavascriptMethod p_Var13;
  RecyclableObject *ptr;
  Var pvVar14;
  double value_00;
  
  BVar7 = VerifyObjectAlive(this);
  if (BVar7 == 0) {
    return 0;
  }
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  this_00 = scriptContext->threadContext;
  BVar7 = EnsureInitialized(this,scriptContext);
  if (BVar7 == 0) goto LAB_00b344d4;
  pTVar2 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  pvVar14 = *(Var *)&(pTVar2[1].propertyCache.ptr)->elements[0].field_0x8;
  if (pvVar14 == (Var)0x0) {
    value = CrossSite::MarshalVar
                      ((((pTVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                       scriptContext.ptr,value,false);
    iVar8 = DynamicObject::SetItem(&this->super_DynamicObject,index,value,flags);
  }
  else {
    function = VarTo<Js::JavascriptFunction>(pvVar14);
    bVar5 = Memory::Recycler::IsHeapEnumInProgress
                      (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                          javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                       recycler);
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                  ,0x27a,"(!GetScriptContext()->IsHeapEnumInProgress())",
                                  "!GetScriptContext()->IsHeapEnumInProgress()");
      if (!bVar5) goto LAB_00b34584;
      *puVar9 = 0;
    }
    pJVar3 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).booleanTrue.ptr;
    if ((int)index < 0) {
      value_00 = (double)index;
      uVar11 = NumberUtilities::ToSpecial(value_00);
      bVar5 = NumberUtilities::IsNan(value_00);
      if (((bVar5) && (uVar12 = NumberUtilities::ToSpecial(value_00), uVar12 != 0xfff8000000000000))
         && (uVar12 = NumberUtilities::ToSpecial(value_00), uVar12 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar5) {
LAB_00b34584:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar9 = 0;
      }
      uVar10 = uVar11 ^ 0xfffc000000000000;
    }
    else {
      uVar10 = (ulong)index | 0x1000000000000;
    }
    if (function == (JavascriptFunction *)0x0) goto LAB_00b344d4;
    bVar5 = this_00->reentrancySafeOrHandled;
    this_00->reentrancySafeOrHandled = true;
    attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
    bVar6 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
    if (bVar6) {
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
      if (this_00->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      CheckIsExecutable((RecyclableObject *)function,p_Var13);
      p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      ptr = (RecyclableObject *)
            (*p_Var13)((RecyclableObject *)function,(CallInfo)function,0x2000005,0,0,0,0,0x2000005,
                       this,0,pJVar3,uVar10,value);
      bVar6 = ThreadContext::IsOnStack(ptr);
LAB_00b343a9:
      if (bVar6 != false) {
        this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      }
    }
    else if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
      if ((attributes & HasNoSideEffect) != None) {
        ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
        if (this_00->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
        CheckIsExecutable((RecyclableObject *)function,p_Var13);
        p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
        ptr = (RecyclableObject *)
              (*p_Var13)((RecyclableObject *)function,(CallInfo)function,0x2000005,0,0,0,0,0x2000005
                         ,this,0,pJVar3,uVar10,value);
        bVar6 = ThreadContext::IsOnStack(ptr);
        goto LAB_00b343a9;
      }
      IVar1 = this_00->implicitCallFlags;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
      if (this_00->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      CheckIsExecutable((RecyclableObject *)function,p_Var13);
      p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      ptr = (RecyclableObject *)
            (*p_Var13)((RecyclableObject *)function,(CallInfo)function,0x2000005,0,0,0,0,0x2000005,
                       this,0,pJVar3,uVar10,value);
      this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
    }
    else {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
              super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
    }
    this_00->reentrancySafeOrHandled = bVar5;
    iVar8 = JavascriptConversion::ToBoolean(ptr,scriptContext);
  }
  if (iVar8 != 0) {
    return 1;
  }
LAB_00b344d4:
  pvVar14 = CrossSite::MarshalVar
                      ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                         javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
                       value,false);
  BVar7 = DynamicObject::SetItem(&this->super_DynamicObject,index,pvVar14,flags);
  return BVar7;
}

Assistant:

BOOL CustomExternalWrapperObject::SetItem(uint32 index, Js::Var value, Js::PropertyOperationFlags flags)
{
    if (!this->VerifyObjectAlive()) return FALSE;

    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        *isPropertyNameNumeric = requestContext->GetLibrary()->GetTrue();
        *propertyNameNumericValue = JavascriptNumber::ToVar(index, requestContext);
        return nullptr;
    };

    auto fn = [&]()->BOOL
    {
        // setting the value could be deferred and now we are on a different context from
        // make sure the value has the same context as the containing object.
        value = Js::CrossSite::MarshalVar(this->GetScriptContext(), value);
        return DynamicObject::SetItem(index, value, flags);
    };
    BOOL trapResult = SetPropertyTrap(this, CustomExternalWrapperObject::SetPropertyTrapKind::SetItemKind, getPropertyName, value, GetScriptContext(), flags, FALSE, fn, nullptr);
    if (!trapResult)
    {
        // setting the value could be deferred and now we are on a different context from
        // make sure the value has the same context as the containing object.
        value = Js::CrossSite::MarshalVar(this->GetScriptContext(), value);
        return Js::DynamicObject::SetItem(index, value, flags);
    }

    return TRUE;
}